

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::
clear_SoundAnalysisPreprocessingType(SoundAnalysisPreprocessing *this)

{
  if ((this->_oneof_case_[0] == 0x14) &&
     ((this->SoundAnalysisPreprocessingType_).vggish_ != (SoundAnalysisPreprocessing_Vggish *)0x0))
  {
    (*(((this->SoundAnalysisPreprocessingType_).vggish_)->super_MessageLite)._vptr_MessageLite[1])()
    ;
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void SoundAnalysisPreprocessing::clear_SoundAnalysisPreprocessingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  switch (SoundAnalysisPreprocessingType_case()) {
    case kVggish: {
      delete SoundAnalysisPreprocessingType_.vggish_;
      break;
    }
    case SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET;
}